

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cpp
# Opt level: O2

void __thiscall
glslang::TReflection::buildUniformStageMask(TReflection *this,TIntermediate *intermediate)

{
  uint *puVar1;
  pointer pTVar2;
  EShLanguage EVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  if ((this->options & EShReflectionAllBlockVariables) == EShReflectionDefault) {
    pTVar2 = (this->indexToUniform).
             super__Vector_base<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar4 = ((long)(this->indexToUniform).
                   super__Vector_base<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar2) / 0x50;
    EVar3 = intermediate->language;
    uVar6 = 0;
    uVar5 = uVar4 & 0xffffffff;
    if ((int)uVar4 < 1) {
      uVar5 = uVar6;
    }
    for (; uVar5 * 0x50 - uVar6 != 0; uVar6 = uVar6 + 0x50) {
      puVar1 = (uint *)((long)&pTVar2->stages + uVar6);
      *puVar1 = *puVar1 | 1 << ((char)EVar3 & 0x1f);
    }
    pTVar2 = (this->indexToBufferVariable).
             super__Vector_base<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar4 = ((long)(this->indexToBufferVariable).
                   super__Vector_base<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar2) / 0x50;
    EVar3 = intermediate->language;
    uVar6 = 0;
    uVar5 = uVar4 & 0xffffffff;
    if ((int)uVar4 < 1) {
      uVar5 = uVar6;
    }
    for (; uVar5 * 0x50 - uVar6 != 0; uVar6 = uVar6 + 0x50) {
      puVar1 = (uint *)((long)&pTVar2->stages + uVar6);
      *puVar1 = *puVar1 | 1 << ((char)EVar3 & 0x1f);
    }
  }
  return;
}

Assistant:

void TReflection::buildUniformStageMask(const TIntermediate& intermediate)
{
    if (options & EShReflectionAllBlockVariables)
        return;

    for (int i = 0; i < int(indexToUniform.size()); ++i) {
        indexToUniform[i].stages = static_cast<EShLanguageMask>(indexToUniform[i].stages | 1 << intermediate.getStage());
    }

    for (int i = 0; i < int(indexToBufferVariable.size()); ++i) {
        indexToBufferVariable[i].stages =
            static_cast<EShLanguageMask>(indexToBufferVariable[i].stages | 1 << intermediate.getStage());
    }
}